

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

QMimeData * __thiscall QUrlModel::mimeData(QUrlModel *this,QModelIndexList *indexes)

{
  QMimeData *this_00;
  long lVar1;
  QModelIndex *index;
  QModelIndex *this_01;
  long in_FS_OFFSET;
  QUrl local_70;
  QArrayDataPointer<QUrl> local_68;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (QUrl *)0x0;
  local_68.size = 0;
  this_01 = (indexes->d).ptr;
  for (lVar1 = (indexes->d).size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    if (this_01->c == 0) {
      QModelIndex::data(&local_50,this_01,0x101);
      ::QVariant::toUrl();
      QList<QUrl>::emplaceBack<QUrl>((QList<QUrl> *)&local_68,&local_70);
      QUrl::~QUrl(&local_70);
      ::QVariant::~QVariant(&local_50);
    }
    this_01 = this_01 + 1;
  }
  this_00 = (QMimeData *)operator_new(0x10);
  QMimeData::QMimeData(this_00);
  QMimeData::setUrls((QList_conflict *)this_00);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QUrlModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QUrl> list;
    for (const auto &index : indexes) {
        if (index.column() == 0)
           list.append(index.data(UrlRole).toUrl());
    }
    QMimeData *data = new QMimeData();
    data->setUrls(list);
    return data;
}